

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  int iVar1;
  undefined1 in_AL;
  bool bVar2;
  undefined7 in_register_00000001;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT71(in_register_00000001,in_AL);
  n = 0;
  do {
    if (0xffff < n) {
      uStack_38 = uStack_38 & 0xffffffffffff;
      ImVector<unsigned_short>::push_back(out_ranges,(unsigned_short *)((long)&uStack_38 + 6));
      return;
    }
    bVar2 = GetBit(this,n);
    if (bVar2) {
      uStack_38._0_6_ = CONCAT24((short)n,(undefined4)uStack_38);
      ImVector<unsigned_short>::push_back(out_ranges,(unsigned_short *)((long)&uStack_38 + 4));
      iVar1 = n;
      do {
        n = iVar1;
        if (n == 0xffff) break;
        bVar2 = GetBit(this,n + 1);
        iVar1 = n + 1;
      } while (bVar2);
      uStack_38._0_4_ = CONCAT22((short)n,(undefined2)uStack_38);
      ImVector<unsigned_short>::push_back(out_ranges,(unsigned_short *)((long)&uStack_38 + 2));
    }
    n = n + 1;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    int max_codepoint = 0x10000;
    for (int n = 0; n < max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint - 1 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}